

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_intersect(bitset_container_t *src_1,bitset_container_t *src_2)

{
  int local_34;
  int i;
  uint64_t *words_2;
  uint64_t *words_1;
  bitset_container_t *src_2_local;
  bitset_container_t *src_1_local;
  
  local_34 = 0;
  while( true ) {
    if (0x3ff < local_34) {
      return false;
    }
    if ((src_1->words[local_34] & src_2->words[local_34]) != 0) break;
    local_34 = local_34 + 1;
  }
  return true;
}

Assistant:

bool bitset_container_intersect(const bitset_container_t *src_1,
                                  const bitset_container_t *src_2) {
	// could vectorize, but this is probably already quite fast in practice
    const uint64_t * __restrict__ words_1 = src_1->words;
    const uint64_t * __restrict__ words_2 = src_2->words;
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i ++) {
        if((words_1[i] & words_2[i]) != 0) return true;
    }
    return false;
}